

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

int Wlc_ObjAlloc(Wlc_Ntk_t *p,int Type,int Signed,int End,int Beg)

{
  int iVar1;
  size_t __size;
  Wlc_Obj_t *pWVar2;
  long lVar3;
  
  if ((Type == 4) || (Type == 2)) {
    __assert_fail("Type != WLC_OBJ_PO && Type != WLC_OBJ_FI",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                  ,0xca,"int Wlc_ObjAlloc(Wlc_Ntk_t *, int, int, int, int)");
  }
  if (p->iObj == p->nObjsAlloc) {
    __size = (long)p->nObjsAlloc * 0x30;
    if (p->pObjs == (Wlc_Obj_t *)0x0) {
      pWVar2 = (Wlc_Obj_t *)malloc(__size);
    }
    else {
      pWVar2 = (Wlc_Obj_t *)realloc(p->pObjs,__size);
    }
    p->pObjs = pWVar2;
    iVar1 = p->nObjsAlloc;
    memset(pWVar2 + iVar1,0,(long)iVar1 * 0x18);
    p->nObjsAlloc = iVar1 * 2;
  }
  lVar3 = (long)p->iObj;
  if ((0 < lVar3) && (p->iObj < p->nObjsAlloc)) {
    pWVar2 = p->pObjs;
    *(ushort *)(pWVar2 + lVar3) =
         (ushort)((Signed & 1U) << 6) | (ushort)Type & 0x3f |
         (ushort)*(undefined4 *)(pWVar2 + lVar3) & 0xff80;
    pWVar2[lVar3].End = End;
    pWVar2[lVar3].Beg = Beg;
    if (((ushort)Type & 0x3d) == 1) {
      Wlc_ObjSetCi(p,pWVar2 + lVar3);
    }
    p->nObjs[Type] = p->nObjs[Type] + 1;
    iVar1 = p->iObj;
    p->iObj = iVar1 + 1;
    return iVar1;
  }
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

int Wlc_ObjAlloc( Wlc_Ntk_t * p, int Type, int Signed, int End, int Beg )
{
    Wlc_Obj_t * pObj;
    assert( Type != WLC_OBJ_PO && Type != WLC_OBJ_FI );
    if ( p->iObj == p->nObjsAlloc )
    {
        p->pObjs = ABC_REALLOC( Wlc_Obj_t, p->pObjs, 2 * p->nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Wlc_Obj_t) * p->nObjsAlloc );
        p->nObjsAlloc *= 2;
    }
    pObj = Wlc_NtkObj( p, p->iObj );
    pObj->Type   = Type;
    pObj->Signed = Signed;
    pObj->End    = End;
    pObj->Beg    = Beg;
    if ( Wlc_ObjIsCi(pObj) )
        Wlc_ObjSetCi( p, pObj );
    p->nObjs[Type]++;
    return p->iObj++;
}